

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::TestOnlyAddNodes
          (GraphCycles *this,uint32_t n)

{
  Node **ppNVar1;
  uint32_t local_1c;
  uint32_t i;
  uint32_t old_size;
  uint32_t n_local;
  GraphCycles *this_local;
  
  local_1c = anon_unknown_0::
             Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>::size
                       (&this->rep_->nodes_);
  anon_unknown_0::Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>::
  resize(&this->rep_->nodes_,n);
  for (; local_1c < n; local_1c = local_1c + 1) {
    ppNVar1 = anon_unknown_0::
              Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>::
              operator[](&this->rep_->nodes_,local_1c);
    *ppNVar1 = (Node *)0x0;
  }
  return;
}

Assistant:

void GraphCycles::TestOnlyAddNodes(uint32_t n) {
  uint32_t old_size = rep_->nodes_.size();
  rep_->nodes_.resize(n);
  for (auto i = old_size; i < n; ++i) {
    rep_->nodes_[i] = nullptr;
  }
}